

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

void __thiscall QMetaMethodBuilder::setReturnType(QMetaMethodBuilder *this,QByteArray *value)

{
  QArrayData *data;
  qsizetype qVar1;
  QMetaMethodBuilderPrivate *pQVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func(this);
  if (pQVar2 != (QMetaMethodBuilderPrivate *)0x0) {
    pcVar3 = (value->d).ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "";
    }
    QMetaObject::normalizedType(&local_38,pcVar3);
    data = &((pQVar2->returnType).d.d)->super_QArrayData;
    pcVar3 = (pQVar2->returnType).d.ptr;
    (pQVar2->returnType).d.d = local_38.d.d;
    (pQVar2->returnType).d.ptr = local_38.d.ptr;
    qVar1 = (pQVar2->returnType).d.size;
    (pQVar2->returnType).d.size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar1;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaMethodBuilder::setReturnType(const QByteArray &value)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        d->returnType = QMetaObject::normalizedType(value);
}